

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O0

ShaderProgram * __thiscall
deqp::gls::TextureTestUtil::ProgramLibrary::getProgram(ProgramLibrary *this,Program program)

{
  RenderContext *renderCtx;
  bool bVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  ShaderProgram *pSVar4;
  TestError *this_00;
  mapped_type *ppSVar5;
  bool local_642;
  bool local_63e;
  bool local_63b;
  ProgramSources local_628;
  ShaderProgram *local_558;
  ShaderProgram *progObj;
  string local_548;
  StringTemplate local_528;
  undefined1 local_508 [8];
  string fragSrc;
  string local_4e0;
  StringTemplate local_4c0;
  undefined1 local_4a0 [8];
  string vertSrc;
  key_type local_478;
  allocator<char> local_451;
  key_type local_450;
  char *local_430;
  char *lookup;
  char *sampler;
  key_type local_418;
  allocator<char> local_3f1;
  key_type local_3f0;
  allocator<char> local_3c9;
  key_type local_3c8;
  allocator<char> local_3a1;
  key_type local_3a0;
  allocator<char> local_379;
  key_type local_378;
  allocator<char> local_351;
  key_type local_350;
  allocator<char> local_329;
  key_type local_328;
  allocator<char> local_301;
  key_type local_300;
  allocator<char> local_2d9;
  key_type local_2d8;
  allocator<char> local_2b1;
  key_type local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  allocator<char> local_269;
  key_type local_268;
  byte local_244;
  byte local_243;
  byte local_242;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  char *local_1a0;
  char *ext;
  undefined1 local_190 [8];
  string version;
  key_type local_168;
  allocator<char> local_141;
  key_type local_140;
  allocator<char> local_119;
  key_type local_118;
  allocator<char> local_f1;
  key_type local_f0;
  allocator<char> local_c9;
  key_type local_c8;
  allocator<char> local_a1;
  key_type local_a0;
  byte local_7a;
  byte local_79;
  byte local_78;
  bool local_77;
  bool local_76;
  bool local_75;
  bool isBuffer;
  bool isCubeArray;
  bool is3D;
  bool is2D;
  bool is1D;
  bool isArray;
  byte local_61;
  undefined1 local_60 [7];
  bool isCube;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  _Self local_28;
  Program local_1c;
  ProgramLibrary *pPStack_18;
  Program program_local;
  ProgramLibrary *this_local;
  
  local_1c = program;
  pPStack_18 = this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
       ::find(&this->m_programs,&local_1c);
  params._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               map<deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
               ::end(&this->m_programs);
  bVar1 = std::operator!=(&local_28,
                          (_Self *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    ppSVar5 = std::
              map<deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
              ::operator[](&this->m_programs,&local_1c);
    this_local = (ProgramLibrary *)*ppSVar5;
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_60);
    local_61 = de::inRange<int>(local_1c,0x10,0x17);
    bVar1 = de::inRange<int>(local_1c,0x1c,0x1f);
    local_63b = true;
    if (!bVar1) {
      local_63b = de::inRange<int>(local_1c,0x18,0x1b);
    }
    local_75 = local_63b;
    bVar1 = de::inRange<int>(local_1c,8,0xe);
    local_63e = true;
    if (!bVar1) {
      bVar1 = de::inRange<int>(local_1c,0x18,0x1b);
      local_63e = true;
      if (!bVar1) {
        local_63e = de::inRange<int>(local_1c,0x2a,0x2c);
      }
    }
    local_76 = local_63e;
    bVar1 = de::inRange<int>(local_1c,0,6);
    local_642 = true;
    if (!bVar1) {
      local_642 = de::inRange<int>(local_1c,0x1c,0x1f);
    }
    local_77 = local_642;
    local_78 = de::inRange<int>(local_1c,0x20,0x25);
    local_79 = de::inRange<int>(local_1c,0x26,0x29);
    local_7a = de::inRange<int>(local_1c,0x2a,0x2c);
    if (this->m_glslVersion == GLSL_VERSION_100_ES) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"FRAG_HEADER",&local_a1);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_a0);
      std::__cxx11::string::operator=((string *)pmVar2,"");
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"VTX_HEADER",&local_c9)
      ;
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_c8);
      std::__cxx11::string::operator=((string *)pmVar2,"");
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"VTX_IN",&local_f1);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_f0);
      std::__cxx11::string::operator=((string *)pmVar2,"attribute");
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"VTX_OUT",&local_119);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_118);
      std::__cxx11::string::operator=((string *)pmVar2,"varying");
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"FRAG_IN",&local_141);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_140);
      std::__cxx11::string::operator=((string *)pmVar2,"varying");
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"FRAG_COLOR",
                 (allocator<char> *)(version.field_2._M_local_buf + 0xf));
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_168);
      std::__cxx11::string::operator=((string *)pmVar2,"gl_FragColor");
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)(version.field_2._M_local_buf + 0xf));
    }
    else if ((((this->m_glslVersion == GLSL_VERSION_300_ES) ||
              (this->m_glslVersion == GLSL_VERSION_310_ES)) ||
             (this->m_glslVersion == GLSL_VERSION_320_ES)) ||
            (this->m_glslVersion == GLSL_VERSION_330)) {
      pcVar3 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_190,pcVar3,(allocator<char> *)((long)&ext + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&ext + 7));
      local_1a0 = (char *)0x0;
      bVar1 = glu::glslVersionIsES(this->m_glslVersion);
      if ((bVar1) && (this->m_glslVersion != GLSL_VERSION_320_ES)) {
        if ((local_79 & 1) == 0) {
          if ((local_7a & 1) != 0) {
            local_1a0 = "GL_EXT_texture_buffer";
          }
        }
        else {
          local_1a0 = "GL_EXT_texture_cube_map_array";
        }
      }
      local_242 = 0;
      local_243 = 0;
      local_244 = 0;
      if (local_1a0 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_200);
      }
      else {
        std::allocator<char>::allocator();
        local_242 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,"\n#extension ",&local_241);
        local_243 = 1;
        std::operator+(&local_220,&local_240,local_1a0);
        local_244 = 1;
        std::operator+(&local_200,&local_220," : require");
      }
      std::operator+(&local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     &local_200);
      std::operator+(&local_1c0,&local_1e0,
                     "\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,"FRAG_HEADER",&local_269);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_268);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator(&local_269);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      if ((local_244 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_220);
      }
      if ((local_243 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_240);
      }
      if ((local_242 & 1) != 0) {
        std::allocator<char>::~allocator(&local_241);
      }
      std::operator+(&local_290,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     "\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"VTX_HEADER",&local_2b1);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_2b0);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"VTX_IN",&local_2d9);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_2d8);
      std::__cxx11::string::operator=((string *)pmVar2,"in");
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"VTX_OUT",&local_301);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_300);
      std::__cxx11::string::operator=((string *)pmVar2,"out");
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator(&local_301);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"FRAG_IN",&local_329);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_328);
      std::__cxx11::string::operator=((string *)pmVar2,"in");
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"FRAG_COLOR",&local_351);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_350);
      std::__cxx11::string::operator=((string *)pmVar2,"dEQP_FragColor");
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
      std::__cxx11::string::~string((string *)local_190);
    }
    pcVar3 = glu::getPrecisionName(this->m_texCoordPrecision);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"PRECISION",&local_379);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_60,&local_378);
    std::__cxx11::string::operator=((string *)pmVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    if ((local_79 & 1) == 0) {
      if ((((local_61 & 1) == 0) && (((local_77 & 1U) == 0 || ((local_75 & 1U) == 0)))) &&
         ((local_78 & 1) == 0)) {
        if ((((local_76 & 1U) == 0) || ((local_75 & 1U) == 0)) && ((local_77 & 1U) == 0)) {
          if ((local_76 & 1U) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_418,"TEXCOORD_TYPE",(allocator<char> *)((long)&sampler + 7))
            ;
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_60,&local_418);
            std::__cxx11::string::operator=((string *)pmVar2,"float");
            std::__cxx11::string::~string((string *)&local_418);
            std::allocator<char>::~allocator((allocator<char> *)((long)&sampler + 7));
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f0,"TEXCOORD_TYPE",&local_3f1);
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_60,&local_3f0);
          std::__cxx11::string::operator=((string *)pmVar2,"vec2");
          std::__cxx11::string::~string((string *)&local_3f0);
          std::allocator<char>::~allocator(&local_3f1);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"TEXCOORD_TYPE",&local_3c9);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_60,&local_3c8);
        std::__cxx11::string::operator=((string *)pmVar2,"vec3");
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator(&local_3c9);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"TEXCOORD_TYPE",&local_3a1);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_3a0);
      std::__cxx11::string::operator=((string *)pmVar2,"vec4");
      std::__cxx11::string::~string((string *)&local_3a0);
      std::allocator<char>::~allocator(&local_3a1);
    }
    lookup = (char *)0x0;
    local_430 = (char *)0x0;
    if (((this->m_glslVersion == GLSL_VERSION_300_ES) ||
        (this->m_glslVersion == GLSL_VERSION_310_ES)) ||
       ((this->m_glslVersion == GLSL_VERSION_320_ES || (this->m_glslVersion == GLSL_VERSION_330))))
    {
      switch(local_1c) {
      case PROGRAM_2D_FLOAT:
        lookup = "sampler2D";
        local_430 = "texture(u_sampler, v_texCoord)";
        break;
      case PROGRAM_2D_INT:
        lookup = "isampler2D";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_2D_UINT:
        lookup = "usampler2D";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_2D_SHADOW:
        lookup = "sampler2DShadow";
        local_430 = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";
        break;
      case PROGRAM_2D_FLOAT_BIAS:
        lookup = "sampler2D";
        local_430 = "texture(u_sampler, v_texCoord, u_bias)";
        break;
      case PROGRAM_2D_INT_BIAS:
        lookup = "isampler2D";
        local_430 = "vec4(texture(u_sampler, v_texCoord, u_bias))";
        break;
      case PROGRAM_2D_UINT_BIAS:
        lookup = "usampler2D";
        local_430 = "vec4(texture(u_sampler, v_texCoord, u_bias))";
        break;
      case PROGRAM_2D_SHADOW_BIAS:
        lookup = "sampler2DShadow";
        local_430 = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref), u_bias), 0.0, 0.0, 1.0)";
        break;
      case PROGRAM_1D_FLOAT:
        lookup = "sampler1D";
        local_430 = "texture(u_sampler, v_texCoord)";
        break;
      case PROGRAM_1D_INT:
        lookup = "isampler1D";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_1D_UINT:
        lookup = "usampler1D";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_1D_SHADOW:
        lookup = "sampler1DShadow";
        local_430 = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";
        break;
      case PROGRAM_1D_FLOAT_BIAS:
        lookup = "sampler1D";
        local_430 = "texture(u_sampler, v_texCoord, u_bias)";
        break;
      case PROGRAM_1D_INT_BIAS:
        lookup = "isampler1D";
        local_430 = "vec4(texture(u_sampler, v_texCoord, u_bias))";
        break;
      case PROGRAM_1D_UINT_BIAS:
        lookup = "usampler1D";
        local_430 = "vec4(texture(u_sampler, v_texCoord, u_bias))";
        break;
      case PROGRAM_1D_SHADOW_BIAS:
        lookup = "sampler1DShadow";
        local_430 = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref), u_bias), 0.0, 0.0, 1.0)";
        break;
      case PROGRAM_CUBE_FLOAT:
        lookup = "samplerCube";
        local_430 = "texture(u_sampler, v_texCoord)";
        break;
      case PROGRAM_CUBE_INT:
        lookup = "isamplerCube";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_CUBE_UINT:
        lookup = "usamplerCube";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_CUBE_SHADOW:
        lookup = "samplerCubeShadow";
        local_430 = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";
        break;
      case PROGRAM_CUBE_FLOAT_BIAS:
        lookup = "samplerCube";
        local_430 = "texture(u_sampler, v_texCoord, u_bias)";
        break;
      case PROGRAM_CUBE_INT_BIAS:
        lookup = "isamplerCube";
        local_430 = "vec4(texture(u_sampler, v_texCoord, u_bias))";
        break;
      case PROGRAM_CUBE_UINT_BIAS:
        lookup = "usamplerCube";
        local_430 = "vec4(texture(u_sampler, v_texCoord, u_bias))";
        break;
      case PROGRAM_CUBE_SHADOW_BIAS:
        lookup = "samplerCubeShadow";
        local_430 = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref), u_bias), 0.0, 0.0, 1.0)";
        break;
      case PROGRAM_1D_ARRAY_FLOAT:
        lookup = "sampler1DArray";
        local_430 = "texture(u_sampler, v_texCoord)";
        break;
      case PROGRAM_1D_ARRAY_INT:
        lookup = "isampler1DArray";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_1D_ARRAY_UINT:
        lookup = "usampler1DArray";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_1D_ARRAY_SHADOW:
        lookup = "sampler1DArrayShadow";
        local_430 = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";
        break;
      case PROGRAM_2D_ARRAY_FLOAT:
        lookup = "sampler2DArray";
        local_430 = "texture(u_sampler, v_texCoord)";
        break;
      case PROGRAM_2D_ARRAY_INT:
        lookup = "isampler2DArray";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_2D_ARRAY_UINT:
        lookup = "usampler2DArray";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_2D_ARRAY_SHADOW:
        lookup = "sampler2DArrayShadow";
        local_430 = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";
        break;
      case PROGRAM_3D_FLOAT:
        lookup = "sampler3D";
        local_430 = "texture(u_sampler, v_texCoord)";
        break;
      case PROGRAM_3D_INT:
        lookup = "isampler3D";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_3D_UINT:
        lookup = "usampler3D";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_3D_FLOAT_BIAS:
        lookup = "sampler3D";
        local_430 = "texture(u_sampler, v_texCoord, u_bias)";
        break;
      case PROGRAM_3D_INT_BIAS:
        lookup = "isampler3D";
        local_430 = "vec4(texture(u_sampler, v_texCoord, u_bias))";
        break;
      case PROGRAM_3D_UINT_BIAS:
        lookup = "usampler3D";
        local_430 = "vec4(texture(u_sampler, v_texCoord, u_bias))";
        break;
      case PROGRAM_CUBE_ARRAY_FLOAT:
        lookup = "samplerCubeArray";
        local_430 = "texture(u_sampler, v_texCoord)";
        break;
      case PROGRAM_CUBE_ARRAY_INT:
        lookup = "isamplerCubeArray";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_CUBE_ARRAY_UINT:
        lookup = "usamplerCubeArray";
        local_430 = "vec4(texture(u_sampler, v_texCoord))";
        break;
      case PROGRAM_CUBE_ARRAY_SHADOW:
        lookup = "samplerCubeArrayShadow";
        local_430 = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";
        break;
      case PROGRAM_BUFFER_FLOAT:
        lookup = "samplerBuffer";
        local_430 = "texelFetch(u_sampler, int(v_texCoord))";
        break;
      case PROGRAM_BUFFER_INT:
        lookup = "isamplerBuffer";
        local_430 = "vec4(texelFetch(u_sampler, int(v_texCoord)))";
        break;
      case PROGRAM_BUFFER_UINT:
        lookup = "usamplerBuffer";
        local_430 = "vec4(texelFetch(u_sampler, int(v_texCoord)))";
      }
    }
    else if (this->m_glslVersion == GLSL_VERSION_100_ES) {
      pcVar3 = "isampler2D";
      if ((local_61 & 1) != 0) {
        pcVar3 = "isamplerCube";
      }
      lookup = pcVar3 + 1;
      switch(local_1c) {
      case PROGRAM_2D_FLOAT:
        local_430 = "texture2D(u_sampler, v_texCoord)";
        break;
      default:
        break;
      case PROGRAM_2D_FLOAT_BIAS:
        local_430 = "texture2D(u_sampler, v_texCoord, u_bias)";
        break;
      case PROGRAM_CUBE_FLOAT:
        local_430 = "textureCube(u_sampler, v_texCoord)";
        break;
      case PROGRAM_CUBE_FLOAT_BIAS:
        local_430 = "textureCube(u_sampler, v_texCoord, u_bias)";
      }
    }
    pcVar3 = lookup;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"SAMPLER_TYPE",&local_451);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_60,&local_450);
    std::__cxx11::string::operator=((string *)pmVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    pcVar3 = local_430;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,"LOOKUP",(allocator<char> *)(vertSrc.field_2._M_local_buf + 0xf)
              );
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_60,&local_478);
    std::__cxx11::string::operator=((string *)pmVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator((allocator<char> *)(vertSrc.field_2._M_local_buf + 0xf));
    pcVar3 = getProgram::vertShaderTemplate;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,pcVar3,(allocator<char> *)(fragSrc.field_2._M_local_buf + 0xf));
    tcu::StringTemplate::StringTemplate(&local_4c0,&local_4e0);
    tcu::StringTemplate::specialize
              ((string *)local_4a0,&local_4c0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_60);
    tcu::StringTemplate::~StringTemplate(&local_4c0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)(fragSrc.field_2._M_local_buf + 0xf));
    pcVar3 = getProgram::fragShaderTemplate;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_548,pcVar3,(allocator<char> *)((long)&progObj + 7));
    tcu::StringTemplate::StringTemplate(&local_528,&local_548);
    tcu::StringTemplate::specialize
              ((string *)local_508,&local_528,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_60);
    tcu::StringTemplate::~StringTemplate(&local_528);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator((allocator<char> *)((long)&progObj + 7));
    pSVar4 = (ShaderProgram *)operator_new(0xd0);
    renderCtx = this->m_context;
    glu::makeVtxFragSources(&local_628,(string *)local_4a0,(string *)local_508);
    glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,&local_628);
    glu::ProgramSources::~ProgramSources(&local_628);
    local_558 = pSVar4;
    bVar1 = glu::ShaderProgram::isOk(pSVar4);
    pSVar4 = local_558;
    if (!bVar1) {
      glu::operator<<(this->m_log,local_558);
      pSVar4 = local_558;
      if (local_558 != (ShaderProgram *)0x0) {
        glu::ShaderProgram::~ShaderProgram(local_558);
        operator_delete(pSVar4,0xd0);
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Failed to compile shader program",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureTestUtil.cpp"
                 ,0x108);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    ppSVar5 = std::
              map<deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
              ::operator[](&this->m_programs,&local_1c);
    *ppSVar5 = pSVar4;
    this_local = (ProgramLibrary *)local_558;
    std::__cxx11::string::~string((string *)local_508);
    std::__cxx11::string::~string((string *)local_4a0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_60);
  }
  return (ShaderProgram *)this_local;
}

Assistant:

glu::ShaderProgram* ProgramLibrary::getProgram (Program program)
{
	if (m_programs.find(program) != m_programs.end())
		return m_programs[program]; // Return from cache.

	static const char* vertShaderTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec4 a_position;\n"
		"${VTX_IN} ${PRECISION} ${TEXCOORD_TYPE} a_texCoord;\n"
		"${VTX_OUT} ${PRECISION} ${TEXCOORD_TYPE} v_texCoord;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_texCoord = a_texCoord;\n"
		"}\n";
	static const char* fragShaderTemplate =
		"${FRAG_HEADER}"
		"${FRAG_IN} ${PRECISION} ${TEXCOORD_TYPE} v_texCoord;\n"
		"uniform ${PRECISION} float u_bias;\n"
		"uniform ${PRECISION} float u_ref;\n"
		"uniform ${PRECISION} vec4 u_colorScale;\n"
		"uniform ${PRECISION} vec4 u_colorBias;\n"
		"uniform ${PRECISION} ${SAMPLER_TYPE} u_sampler;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} = ${LOOKUP} * u_colorScale + u_colorBias;\n"
		"}\n";

	map<string, string> params;

	bool	isCube		= de::inRange<int>(program, PROGRAM_CUBE_FLOAT, PROGRAM_CUBE_SHADOW_BIAS);
	bool	isArray		= de::inRange<int>(program, PROGRAM_2D_ARRAY_FLOAT, PROGRAM_2D_ARRAY_SHADOW)
							|| de::inRange<int>(program, PROGRAM_1D_ARRAY_FLOAT, PROGRAM_1D_ARRAY_SHADOW);

	bool	is1D		= de::inRange<int>(program, PROGRAM_1D_FLOAT, PROGRAM_1D_UINT_BIAS)
							|| de::inRange<int>(program, PROGRAM_1D_ARRAY_FLOAT, PROGRAM_1D_ARRAY_SHADOW)
							|| de::inRange<int>(program, PROGRAM_BUFFER_FLOAT, PROGRAM_BUFFER_UINT);

	bool	is2D		= de::inRange<int>(program, PROGRAM_2D_FLOAT, PROGRAM_2D_UINT_BIAS)
							|| de::inRange<int>(program, PROGRAM_2D_ARRAY_FLOAT, PROGRAM_2D_ARRAY_SHADOW);

	bool	is3D		= de::inRange<int>(program, PROGRAM_3D_FLOAT, PROGRAM_3D_UINT_BIAS);
	bool	isCubeArray	= de::inRange<int>(program, PROGRAM_CUBE_ARRAY_FLOAT, PROGRAM_CUBE_ARRAY_SHADOW);
	bool	isBuffer	= de::inRange<int>(program, PROGRAM_BUFFER_FLOAT, PROGRAM_BUFFER_UINT);

	if (m_glslVersion == glu::GLSL_VERSION_100_ES)
	{
		params["FRAG_HEADER"]	= "";
		params["VTX_HEADER"]	= "";
		params["VTX_IN"]		= "attribute";
		params["VTX_OUT"]		= "varying";
		params["FRAG_IN"]		= "varying";
		params["FRAG_COLOR"]	= "gl_FragColor";
	}
	else if (m_glslVersion == glu::GLSL_VERSION_300_ES || m_glslVersion == glu::GLSL_VERSION_310_ES || m_glslVersion == glu::GLSL_VERSION_320_ES || m_glslVersion == glu::GLSL_VERSION_330)
	{
		const string	version	= glu::getGLSLVersionDeclaration(m_glslVersion);
		const char*		ext		= DE_NULL;

		if (glu::glslVersionIsES(m_glslVersion) && m_glslVersion != glu::GLSL_VERSION_320_ES) {
			if (isCubeArray)
				ext = "GL_EXT_texture_cube_map_array";
			else if (isBuffer)
				ext = "GL_EXT_texture_buffer";
		}

		params["FRAG_HEADER"]	= version + (ext ? string("\n#extension ") + ext + " : require" : string()) + "\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n";
		params["VTX_HEADER"]	= version + "\n";
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "dEQP_FragColor";
	}
	else
		DE_FATAL("Unsupported version");

	params["PRECISION"]		= glu::getPrecisionName(m_texCoordPrecision);

	if (isCubeArray)
		params["TEXCOORD_TYPE"]	= "vec4";
	else if (isCube || (is2D && isArray) || is3D)
		params["TEXCOORD_TYPE"]	= "vec3";
	else if ((is1D && isArray) || is2D)
		params["TEXCOORD_TYPE"]	= "vec2";
	else if (is1D)
		params["TEXCOORD_TYPE"]	= "float";
	else
		DE_ASSERT(DE_FALSE);

	const char*	sampler	= DE_NULL;
	const char*	lookup	= DE_NULL;

	if (m_glslVersion == glu::GLSL_VERSION_300_ES || m_glslVersion == glu::GLSL_VERSION_310_ES || m_glslVersion == glu::GLSL_VERSION_320_ES || m_glslVersion == glu::GLSL_VERSION_330)
	{
		switch (program)
		{
			case PROGRAM_2D_FLOAT:			sampler = "sampler2D";				lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_2D_INT:			sampler = "isampler2D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_2D_UINT:			sampler = "usampler2D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_2D_SHADOW:			sampler = "sampler2DShadow";		lookup = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_2D_FLOAT_BIAS:		sampler = "sampler2D";				lookup = "texture(u_sampler, v_texCoord, u_bias)";										break;
			case PROGRAM_2D_INT_BIAS:		sampler = "isampler2D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_2D_UINT_BIAS:		sampler = "usampler2D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_2D_SHADOW_BIAS:	sampler = "sampler2DShadow";		lookup = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref), u_bias), 0.0, 0.0, 1.0)";	break;
			case PROGRAM_1D_FLOAT:			sampler = "sampler1D";				lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_1D_INT:			sampler = "isampler1D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_1D_UINT:			sampler = "usampler1D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_1D_SHADOW:			sampler = "sampler1DShadow";		lookup = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_1D_FLOAT_BIAS:		sampler = "sampler1D";				lookup = "texture(u_sampler, v_texCoord, u_bias)";										break;
			case PROGRAM_1D_INT_BIAS:		sampler = "isampler1D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_1D_UINT_BIAS:		sampler = "usampler1D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_1D_SHADOW_BIAS:	sampler = "sampler1DShadow";		lookup = "vec4(texture(u_sampler, vec3(v_texCoord, u_ref), u_bias), 0.0, 0.0, 1.0)";	break;
			case PROGRAM_CUBE_FLOAT:		sampler = "samplerCube";			lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_CUBE_INT:			sampler = "isamplerCube";			lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_CUBE_UINT:			sampler = "usamplerCube";			lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_CUBE_SHADOW:		sampler = "samplerCubeShadow";		lookup = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_CUBE_FLOAT_BIAS:	sampler = "samplerCube";			lookup = "texture(u_sampler, v_texCoord, u_bias)";										break;
			case PROGRAM_CUBE_INT_BIAS:		sampler = "isamplerCube";			lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_CUBE_UINT_BIAS:	sampler = "usamplerCube";			lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_CUBE_SHADOW_BIAS:	sampler = "samplerCubeShadow";		lookup = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref), u_bias), 0.0, 0.0, 1.0)";	break;
			case PROGRAM_2D_ARRAY_FLOAT:	sampler = "sampler2DArray";			lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_2D_ARRAY_INT:		sampler = "isampler2DArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_2D_ARRAY_UINT:		sampler = "usampler2DArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_2D_ARRAY_SHADOW:	sampler = "sampler2DArrayShadow";	lookup = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_3D_FLOAT:			sampler = "sampler3D";				lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_3D_INT:			sampler = "isampler3D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_3D_UINT:			sampler = "usampler3D";				lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_3D_FLOAT_BIAS:		sampler = "sampler3D";				lookup = "texture(u_sampler, v_texCoord, u_bias)";										break;
			case PROGRAM_3D_INT_BIAS:		sampler = "isampler3D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_3D_UINT_BIAS:		sampler = "usampler3D";				lookup = "vec4(texture(u_sampler, v_texCoord, u_bias))";								break;
			case PROGRAM_CUBE_ARRAY_FLOAT:	sampler = "samplerCubeArray";		lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_CUBE_ARRAY_INT:	sampler = "isamplerCubeArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_CUBE_ARRAY_UINT:	sampler = "usamplerCubeArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_CUBE_ARRAY_SHADOW:	sampler = "samplerCubeArrayShadow";	lookup = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_1D_ARRAY_FLOAT:	sampler = "sampler1DArray";			lookup = "texture(u_sampler, v_texCoord)";												break;
			case PROGRAM_1D_ARRAY_INT:		sampler = "isampler1DArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_1D_ARRAY_UINT:		sampler = "usampler1DArray";		lookup = "vec4(texture(u_sampler, v_texCoord))";										break;
			case PROGRAM_1D_ARRAY_SHADOW:	sampler = "sampler1DArrayShadow";	lookup = "vec4(texture(u_sampler, vec4(v_texCoord, u_ref)), 0.0, 0.0, 1.0)";			break;
			case PROGRAM_BUFFER_FLOAT:		sampler = "samplerBuffer";			lookup = "texelFetch(u_sampler, int(v_texCoord))";										break;
			case PROGRAM_BUFFER_INT:		sampler = "isamplerBuffer";			lookup = "vec4(texelFetch(u_sampler, int(v_texCoord)))";								break;
			case PROGRAM_BUFFER_UINT:		sampler = "usamplerBuffer";			lookup = "vec4(texelFetch(u_sampler, int(v_texCoord)))";								break;
			default:
				DE_ASSERT(false);
		}
	}
	else if (m_glslVersion == glu::GLSL_VERSION_100_ES)
	{
		sampler = isCube ? "samplerCube" : "sampler2D";

		switch (program)
		{
			case PROGRAM_2D_FLOAT:			lookup = "texture2D(u_sampler, v_texCoord)";			break;
			case PROGRAM_2D_FLOAT_BIAS:		lookup = "texture2D(u_sampler, v_texCoord, u_bias)";	break;
			case PROGRAM_CUBE_FLOAT:		lookup = "textureCube(u_sampler, v_texCoord)";			break;
			case PROGRAM_CUBE_FLOAT_BIAS:	lookup = "textureCube(u_sampler, v_texCoord, u_bias)";	break;
			default:
				DE_ASSERT(false);
		}
	}
	else
		DE_FATAL("Unsupported version");

	params["SAMPLER_TYPE"]	= sampler;
	params["LOOKUP"]		= lookup;

	std::string vertSrc = tcu::StringTemplate(vertShaderTemplate).specialize(params);
	std::string fragSrc = tcu::StringTemplate(fragShaderTemplate).specialize(params);

	glu::ShaderProgram* progObj = new glu::ShaderProgram(m_context, glu::makeVtxFragSources(vertSrc, fragSrc));
	if (!progObj->isOk())
	{
		m_log << *progObj;
		delete progObj;
		TCU_FAIL("Failed to compile shader program");
	}

	try
	{
		m_programs[program] = progObj;
	}
	catch (...)
	{
		delete progObj;
		throw;
	}

	return progObj;
}